

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardize_data_array.h
# Opt level: O0

void polyscope::
     validateSize<geometrycentral::MeshData<geometrycentral::surface::Vertex,geometrycentral::Vector3>>
               (MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3> *inputData,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *expectedSizes,
               string *errorName)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference puVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  size_t possibleSize_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3_1;
  string sizesStr;
  size_t possibleSize;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  size_t dataSize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd58;
  allocator *this;
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3> *in_stack_fffffffffffffd60;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_278 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  string *in_stack_fffffffffffffdc0;
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  unsigned_long local_178;
  unsigned_long *local_170;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_168 [2];
  allocator local_151;
  string local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  unsigned_long *local_128;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_120 [2];
  string local_110 [32];
  string local_f0 [48];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
  if (sVar2 != 0) {
    local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               adaptorF_size<geometrycentral::MeshData<geometrycentral::surface::Vertex,geometrycentral::Vector3>>
                         (in_stack_fffffffffffffd60);
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
    if (sVar2 == 1) {
      __lhs = local_20;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,0);
      if (__lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*pvVar3) {
        __rhs = local_c0;
        std::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        std::operator+(__lhs,(char *)__rhs);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,0);
        std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd98);
        std::operator+(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
        std::operator+(__lhs,(char *)__rhs);
        std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd98);
        std::operator+(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
        exception(in_stack_fffffffffffffdc0);
        std::__cxx11::string::~string(local_40);
        std::__cxx11::string::~string(local_110);
        std::__cxx11::string::~string(local_60);
        std::__cxx11::string::~string(local_80);
        std::__cxx11::string::~string(local_f0);
        std::__cxx11::string::~string(local_a0);
        std::__cxx11::string::~string(local_c0);
      }
    }
    else {
      local_120[0]._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     (in_stack_fffffffffffffd58);
      local_128 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            (in_stack_fffffffffffffd58);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffd60,
                                (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffd58), bVar1) {
        puVar4 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(local_120);
        local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar4;
        if (local_20 == local_130) {
          return;
        }
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(local_120);
      }
      this = &local_151;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,"{",this);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      local_168[0]._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
      local_170 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffd60,
                                (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)this), bVar1) {
        puVar4 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(local_168);
        local_178 = *puVar4;
        std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd98);
        std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
        std::__cxx11::string::operator+=(local_150,local_198);
        std::__cxx11::string::~string(local_198);
        std::__cxx11::string::~string(local_1b8);
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(local_168);
      }
      std::__cxx11::string::operator+=(local_150,"}");
      std::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
      std::operator+(in_stack_fffffffffffffd68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd60);
      std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd98);
      std::operator+(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      exception(in_stack_fffffffffffffdc0);
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::string::~string(local_278);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::string::~string(local_218);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffda8);
      std::__cxx11::string::~string(local_150);
    }
  }
  return;
}

Assistant:

void validateSize(const T& inputData, std::vector<size_t> expectedSizes, std::string errorName = "") {
  // No-op if no sizes given
  if (expectedSizes.size() == 0) {
    return;
  }

  size_t dataSize = adaptorF_size(inputData);

  // Simpler error if only one size
  if (expectedSizes.size() == 1) {
    if (dataSize != expectedSizes[0]) {
      exception("Size validation failed on data array [" + errorName + "]. Expected size " +
                std::to_string(expectedSizes[0]) + " but has size " + std::to_string(dataSize));
    }
  }
  // General case
  else {

    // Return success if any sizes match
    for (size_t possibleSize : expectedSizes) {
      if (dataSize == possibleSize) {
        return;
      }
    }

    // Build a useful error message
    std::string sizesStr = "{";
    for (size_t possibleSize : expectedSizes) {
      sizesStr += std::to_string(possibleSize) + ",";
    }
    sizesStr += "}";

    exception("Size validation failed on data array [" + errorName + "]. Expected size in " + sizesStr +
              " but has size " + std::to_string(dataSize));
  }
}